

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O3

int uv__tcsetattr(int fd,int how,termios *term)

{
  int iVar1;
  int *piVar2;
  
  do {
    iVar1 = tcsetattr(fd,how,(termios *)term);
    if (iVar1 != -1) {
      return 0;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  return -*piVar2;
}

Assistant:

int uv__tcsetattr(int fd, int how, const struct termios *term) {
  int rc;

  do
    rc = tcsetattr(fd, how, term);
  while (rc == -1 && errno == EINTR);

  if (rc == -1)
    return UV__ERR(errno);

  return 0;
}